

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox
               (ImGuiWindow *window,ImDrawList *draw_list,ImDrawCmd *draw_cmd,bool show_mesh,
               bool show_aabb)

{
  ImDrawList *this;
  uint uVar1;
  uint uVar2;
  ImDrawVert *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  uint uVar6;
  unsigned_short *puVar7;
  ImVec2 *p;
  long lVar8;
  ImVec2 triangle [3];
  ImVec2 local_70;
  ImRect local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar4 = GImGui;
  if ((draw_list->IdxBuffer).Size < 1) {
    puVar7 = (unsigned_short *)0x0;
  }
  else {
    puVar7 = (draw_list->IdxBuffer).Data;
  }
  this = &GImGui->ForegroundDrawList;
  uVar1 = draw_cmd->VtxOffset;
  pIVar3 = (draw_list->VtxBuffer).Data;
  local_58._0_4_ = (draw_cmd->ClipRect).x;
  local_58._4_4_ = (draw_cmd->ClipRect).y;
  uStack_50 = 0;
  local_48._0_4_ = (draw_cmd->ClipRect).z;
  local_48._4_4_ = (draw_cmd->ClipRect).w;
  uStack_40 = 0;
  local_68.Min.x = 3.4028235e+38;
  local_68.Min.y = 3.4028235e+38;
  local_68.Max.x = -3.4028235e+38;
  local_68.Max.y = -3.4028235e+38;
  uVar2 = (GImGui->ForegroundDrawList).Flags;
  (GImGui->ForegroundDrawList).Flags = uVar2 & 0xfffffffe;
  uVar5 = draw_cmd->IdxOffset;
  uVar6 = uVar5;
  while (uVar6 < uVar5 + draw_cmd->ElemCount) {
    triangle[0].x = 0.0;
    triangle[0].y = 0.0;
    triangle[1].x = 0.0;
    triangle[1].y = 0.0;
    triangle[2].x = 0.0;
    triangle[2].y = 0.0;
    for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 8) {
      uVar5 = uVar6;
      if (puVar7 != (unsigned_short *)0x0) {
        uVar5 = (uint)puVar7[uVar6];
      }
      p = (ImVec2 *)((long)&triangle[0].x + lVar8);
      *p = pIVar3[(ulong)uVar1 + (ulong)uVar5].pos;
      ImRect::Add(&local_68,p);
      uVar6 = uVar6 + 1;
    }
    if (show_mesh) {
      ImDrawList::AddPolyline(this,triangle,3,0xff00ffff,true,1.0);
    }
    uVar5 = draw_cmd->IdxOffset;
  }
  if (show_aabb) {
    triangle[0].y = (float)(int)local_58._4_4_;
    triangle[0].x = (float)(int)(float)local_58;
    local_70.y = (float)(int)local_48._4_4_;
    local_70.x = (float)(int)(float)local_48;
    ImDrawList::AddRect(this,triangle,&local_70,0xffff00ff,0.0,0xf,1.0);
    triangle[0].y = (float)(int)local_68.Min.y;
    triangle[0].x = (float)(int)local_68.Min.x;
    local_70.y = (float)(int)local_68.Max.y;
    local_70.x = (float)(int)local_68.Max.x;
    ImDrawList::AddRect(this,triangle,&local_70,0xffffff00,0.0,0xf,1.0);
  }
  (pIVar4->ForegroundDrawList).Flags = uVar2;
  return;
}

Assistant:

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImGuiWindow* window, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, bool show_mesh, bool show_aabb)
{
    IM_ASSERT(show_mesh || show_aabb);
    ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
    ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + draw_cmd->VtxOffset;

    // Draw wire-frame version of all triangles
    ImRect clip_rect = draw_cmd->ClipRect;
    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    ImDrawListFlags backup_flags = fg_draw_list->Flags;
    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
    for (unsigned int idx_n = draw_cmd->IdxOffset; idx_n < draw_cmd->IdxOffset + draw_cmd->ElemCount; )
    {
        ImVec2 triangle[3];
        for (int n = 0; n < 3; n++, idx_n++)
            vtxs_rect.Add((triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos));
        if (show_mesh)
            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
    }
    // Draw bounding boxes
    if (show_aabb)
    {
        fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
        fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
    }
    fg_draw_list->Flags = backup_flags;
}